

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int generate_by_descriptor_wsh
              (miniscript_node_t *node,miniscript_node_t *parent,int32_t derive_child_num,
              uchar *script,size_t script_len,size_t *write_len)

{
  uchar local_78 [8];
  uchar output [34];
  size_t child_write_len;
  int ret;
  size_t *write_len_local;
  size_t script_len_local;
  uchar *script_local;
  int32_t derive_child_num_local;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  unique0x00012000 = *write_len;
  if (((node->child == (miniscript_node_t *)0x0) || (script_len < 0x22)) ||
     ((parent != (miniscript_node_t *)0x0 && (parent->info == (miniscript_item_t *)0x0)))) {
    node_local._4_4_ = -2;
  }
  else {
    node_local._4_4_ =
         generate_script_from_miniscript
                   (node->child,node,derive_child_num,script,script_len,(size_t *)(output + 0x20));
    if (node_local._4_4_ == 0) {
      if (stack0xffffffffffffffb0 < 0x209) {
        node_local._4_4_ =
             wally_witness_program_from_bytes
                       (script,stack0xffffffffffffffb0,2,local_78,0x22,write_len);
        if (node_local._4_4_ == 0) {
          memcpy(script,local_78,*write_len);
        }
      }
      else {
        node_local._4_4_ = -2;
      }
    }
  }
  return node_local._4_4_;
}

Assistant:

static int generate_by_descriptor_wsh(
    struct miniscript_node_t *node,
    struct miniscript_node_t *parent,
    int32_t derive_child_num,
    unsigned char *script,
    size_t script_len,
    size_t *write_len)
{
    int ret;
    size_t child_write_len = *write_len;
    unsigned char output[WALLY_SCRIPTPUBKEY_P2WSH_LEN];

    if (!node->child || (script_len < sizeof(output)) || (parent && !parent->info))
        return WALLY_EINVAL;

    ret = generate_script_from_miniscript(node->child, node, derive_child_num, script, script_len, &child_write_len);
    if (ret != WALLY_OK)
        return ret;

    if (child_write_len > DESCRIPTOR_REDEEM_SCRIPT_MAX_SIZE)
        return WALLY_EINVAL;

    ret = wally_witness_program_from_bytes(script, child_write_len, WALLY_SCRIPT_SHA256, output, WALLY_SCRIPTPUBKEY_P2WSH_LEN, write_len);
    if (ret == WALLY_OK)
        memcpy(script, output, *write_len);

    return ret;
}